

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall Fl_Help_View::value(Fl_Help_View *this,char *val)

{
  uint *puVar1;
  char *pcVar2;
  
  if (current_view == this) {
    clear_global_selection(this);
  }
  free_data(this);
  puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (val != (char *)0x0) {
    pcVar2 = strdup(val);
    this->value_ = pcVar2;
    initial_load = 1;
    format(this);
    initial_load = 0;
    topline(this,0);
    leftline(this,0);
    return;
  }
  return;
}

Assistant:

void
Fl_Help_View::value(const char *val)	// I - Text to view
{
  clear_selection();
  free_data();
  set_changed();

  if (!val)
    return;

  value_ = strdup(val);

  initial_load = 1;
  format();
  initial_load = 0;

  topline(0);
  leftline(0);
}